

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

int run_test_threadpool_cancel_getaddrinfo(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  addrinfo hints;
  cancel_info ci;
  uv_getaddrinfo_t reqs [4];
  
  ci.nreqs = 4;
  ci.stride = 0xa0;
  ci.reqs = reqs;
  puVar2 = uv_default_loop();
  saturate_threadpool();
  iVar1 = uv_getaddrinfo(puVar2,reqs,getaddrinfo_cb,"fail",(char *)0x0,(addrinfo *)0x0);
  if (iVar1 == 0) {
    iVar1 = uv_getaddrinfo(puVar2,reqs + 1,getaddrinfo_cb,(char *)0x0,"fail",(addrinfo *)0x0);
    if (iVar1 == 0) {
      iVar1 = uv_getaddrinfo(puVar2,reqs + 2,getaddrinfo_cb,"fail","fail",(addrinfo *)0x0);
      if (iVar1 == 0) {
        iVar1 = uv_getaddrinfo(puVar2,reqs + 3,getaddrinfo_cb,"fail",(char *)0x0,&hints);
        if (iVar1 == 0) {
          iVar1 = uv_timer_init(puVar2,&ci.timer_handle);
          if (iVar1 == 0) {
            iVar1 = uv_timer_start(&ci.timer_handle,timer_cb,10,0);
            if (iVar1 == 0) {
              iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
              if (iVar1 == 0) {
                if (timer_cb_called == 1) {
                  puVar2 = uv_default_loop();
                  close_loop(puVar2);
                  puVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar2);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                  uVar3 = 0xc0;
                }
                else {
                  pcVar4 = "1 == timer_cb_called";
                  uVar3 = 0xbe;
                }
              }
              else {
                pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                uVar3 = 0xbd;
              }
            }
            else {
              pcVar4 = "0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0)";
              uVar3 = 0xbc;
            }
          }
          else {
            pcVar4 = "0 == uv_timer_init(loop, &ci.timer_handle)";
            uVar3 = 0xbb;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0xb9;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0xb6;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0xb3;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0xb0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(threadpool_cancel_getaddrinfo) {
  uv_getaddrinfo_t reqs[4];
  struct cancel_info ci;
  struct addrinfo hints;
  uv_loop_t* loop;
  int r;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  r = uv_getaddrinfo(loop, reqs + 0, getaddrinfo_cb, "fail", NULL, NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 1, getaddrinfo_cb, NULL, "fail", NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 2, getaddrinfo_cb, "fail", "fail", NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 3, getaddrinfo_cb, "fail", NULL, &hints);
  ASSERT(r == 0);

  ASSERT(0 == uv_timer_init(loop, &ci.timer_handle));
  ASSERT(0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}